

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBailOut.cpp
# Opt level: O0

void __thiscall
GlobOpt::CaptureValuesFromScratch
          (GlobOpt *this,BasicBlock *block,EditingIterator *bailOutConstValuesIter,
          EditingIterator *bailOutCopySymsIter,BVSparse<Memory::JitArenaAllocator> *argsToCapture)

{
  Value *this_00;
  code *pcVar1;
  GlobHashBucket *this_01;
  bool bVar2;
  uint key;
  undefined4 *puVar3;
  Type_conflict node;
  Type *pTVar4;
  ValueInfo *pVVar5;
  Sym *pSVar6;
  StackSym *pSVar7;
  HashBucket *pHVar8;
  VarConstantValueInfo *this_02;
  Var value_00;
  BailoutConstantValue param2;
  BailoutConstantValue param2_00;
  undefined1 local_e0 [8];
  BailoutConstantValue constValue_1;
  anon_union_8_3_5e50e90d_for_u local_c0;
  BailoutConstantValue constValue;
  int intConstantValue;
  StackSym *stackSym;
  HashBucket<Sym_*,_Value_*> *bucket_1;
  SparseBVUnit _unit;
  BVIndex _startIndex;
  BVIndex _offset;
  BVSparseNode<Memory::JitArenaAllocator> *_curNode;
  BVIndex symId;
  GlobHashBucket *bucket;
  Iterator __iter;
  uint _iterHash;
  ValueInfo *valueInfo;
  Value *value;
  Sym *sym;
  BVSparse<Memory::JitArenaAllocator> *argsToCapture_local;
  EditingIterator *bailOutCopySymsIter_local;
  EditingIterator *bailOutConstValuesIter_local;
  BasicBlock *block_local;
  GlobOpt *this_local;
  
  BVSparse<Memory::JitArenaAllocator>::ClearAll((block->globOptData).changedSyms);
  for (__iter.current._4_4_ = 0;
      __iter.current._4_4_ < ((block->globOptData).symToValueMap)->tableSize;
      __iter.current._4_4_ = __iter.current._4_4_ + 1) {
    _bucket = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::GetIterator
                        (((block->globOptData).symToValueMap)->table + __iter.current._4_4_);
    while( true ) {
      if (__iter.list ==
          (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      this_01 = bucket;
      node = SListNodeBase<Memory::ArenaAllocator>::Next
                       (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      bVar2 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::IsHead
                        ((SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *
                         )this_01,node);
      if (bVar2) break;
      SListNodeBase<Memory::ArenaAllocator>::Next
                (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      pTVar4 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::Iterator::
               Data((Iterator *)&bucket);
      pVVar5 = ::Value::GetValueInfo(pTVar4->element);
      pSVar6 = ValueInfo::GetSymStore(pVVar5);
      if ((((pSVar6 != (Sym *)0x0) || (bVar2 = ValueInfo::HasIntConstantValue(pVVar5,false), bVar2))
          && (pSVar6 = pTVar4->value, pSVar6 != (Sym *)0x0)) &&
         (bVar2 = Sym::IsStackSym(pSVar6), bVar2)) {
        pSVar7 = Sym::AsStackSym(pSVar6);
        bVar2 = StackSym::HasByteCodeRegSlot(pSVar7);
        if (bVar2) {
          BVSparse<Memory::JitArenaAllocator>::Set((block->globOptData).changedSyms,pSVar6->m_id);
        }
      }
    }
  }
  if (argsToCapture != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    BVSparse<Memory::JitArenaAllocator>::Or((block->globOptData).changedSyms,argsToCapture);
  }
  __startIndex = ((block->globOptData).changedSyms)->head;
  while( true ) {
    if (__startIndex == (Type_conflict)0x0) {
      return;
    }
    _unit.word._0_4_ = __startIndex->startIndex;
    bucket_1 = (HashBucket<Sym_*,_Value_*> *)(__startIndex->data).word;
    _unit.word._4_4_ = BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&bucket_1);
    while (_unit.word._4_4_ != 0xffffffff) {
      key = (Type)_unit.word + _unit.word._4_4_;
      BVUnitT<unsigned_long>::Clear((BVUnitT<unsigned_long> *)&bucket_1,_unit.word._4_4_);
      pHVar8 = ValueHashTable<Sym_*,_Value_*>::GetBucket((block->globOptData).symToValueMap,key);
      pSVar7 = Sym::AsStackSym(pHVar8->value);
      this_00 = pHVar8->element;
      pVVar5 = ::Value::GetValueInfo(this_00);
      bVar2 = ValueInfo::TryGetIntConstantValue
                        (pVVar5,(int32 *)((long)&constValue.u.intConst.value + 4),false);
      if (bVar2) {
        BailoutConstantValue::InitIntConstValue
                  ((BailoutConstantValue *)&local_c0.intConst,constValue.u.intConst.value._4_4_);
        constValue_1.u = local_c0;
        param2._0_8_ = (ulong)local_c0 & 0xff;
        param2.u = (anon_union_8_3_5e50e90d_for_u)constValue._0_8_;
        SListBase<JsUtil::KeyValuePair<StackSym*,BailoutConstantValue>,Memory::ArenaAllocator,RealCount>
        ::EditingIterator::InsertNodeBefore<StackSym*,BailoutConstantValue>
                  ((EditingIterator *)bailOutConstValuesIter,
                   &this->func->m_alloc->super_ArenaAllocator,pSVar7,param2);
      }
      else {
        bVar2 = ValueInfo::IsVarConstant(pVVar5);
        if (bVar2) {
          this_02 = ValueInfo::AsVarConstant(pVVar5);
          value_00 = VarConstantValueInfo::VarValue(this_02,false);
          BailoutConstantValue::InitVarConstValue((BailoutConstantValue *)local_e0,value_00);
          param2_00._0_8_ = (ulong)local_e0 & 0xff;
          param2_00.u = (anon_union_8_3_5e50e90d_for_u)constValue_1._0_8_;
          SListBase<JsUtil::KeyValuePair<StackSym*,BailoutConstantValue>,Memory::ArenaAllocator,RealCount>
          ::EditingIterator::InsertNodeBefore<StackSym*,BailoutConstantValue>
                    ((EditingIterator *)bailOutConstValuesIter,
                     &this->func->m_alloc->super_ArenaAllocator,pSVar7,param2_00);
        }
        else {
          CaptureCopyPropValue(this,block,&pSVar7->super_Sym,this_00,bailOutCopySymsIter);
        }
      }
      _unit.word._4_4_ = BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&bucket_1);
    }
    if (__startIndex == (Type_conflict)0x0) break;
    __startIndex = __startIndex->next;
  }
  return;
}

Assistant:

void
GlobOpt::CaptureValuesFromScratch(BasicBlock * block,
    SListBase<ConstantStackSymValue>::EditingIterator & bailOutConstValuesIter,
    SListBase<CopyPropSyms>::EditingIterator & bailOutCopySymsIter,
    BVSparse<JitArenaAllocator>* argsToCapture)
{
    Sym * sym = nullptr;
    Value * value = nullptr;
    ValueInfo * valueInfo = nullptr;

    block->globOptData.changedSyms->ClearAll();

    FOREACH_VALUEHASHTABLE_ENTRY(GlobHashBucket, bucket, block->globOptData.symToValueMap)
    {
        value = bucket.element;
        valueInfo = value->GetValueInfo();

        if (valueInfo->GetSymStore() == nullptr && !valueInfo->HasIntConstantValue())
        {
            continue;
        }

        sym = bucket.value;
        if (sym == nullptr || !sym->IsStackSym() || !(sym->AsStackSym()->HasByteCodeRegSlot()))
        {
            continue;
        }
        block->globOptData.changedSyms->Set(sym->m_id);
    }
    NEXT_VALUEHASHTABLE_ENTRY;

    if (argsToCapture)
    {
        block->globOptData.changedSyms->Or(argsToCapture);
    }

    FOREACH_BITSET_IN_SPARSEBV(symId, block->globOptData.changedSyms)
    {
        HashBucket<Sym*, Value*> * bucket = block->globOptData.symToValueMap->GetBucket(symId);
        StackSym * stackSym = bucket->value->AsStackSym();
        value =  bucket->element;
        valueInfo = value->GetValueInfo();

        int intConstantValue;
        if (valueInfo->TryGetIntConstantValue(&intConstantValue))
        {
            BailoutConstantValue constValue;
            constValue.InitIntConstValue(intConstantValue);
            bailOutConstValuesIter.InsertNodeBefore(this->func->m_alloc, stackSym, constValue);
        }
        else if (valueInfo->IsVarConstant())
        {
            BailoutConstantValue constValue;
            constValue.InitVarConstValue(valueInfo->AsVarConstant()->VarValue());
            bailOutConstValuesIter.InsertNodeBefore(this->func->m_alloc, stackSym, constValue);
        }
        else
        {
            CaptureCopyPropValue(block, stackSym, value, bailOutCopySymsIter);
        }
    }
    NEXT_BITSET_IN_SPARSEBV
}